

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_ldrddi.cpp
# Opt level: O0

ze_result_t
loader::zesPowerGetProperties(zes_pwr_handle_t hPower,zes_power_properties_t *pProperties)

{
  zes_pfnPowerGetProperties_t pfnGetProperties;
  dditable_t *dditable;
  ze_result_t result;
  zes_power_properties_t *pProperties_local;
  zes_pwr_handle_t hPower_local;
  
  if (*(code **)(*(long *)(hPower + 8) + 0xa98) == (code *)0x0) {
    hPower_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    hPower_local._4_4_ =
         (**(code **)(*(long *)(hPower + 8) + 0xa98))(*(undefined8 *)hPower,pProperties);
  }
  return hPower_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesPowerGetProperties(
        zes_pwr_handle_t hPower,                        ///< [in] Handle for the component.
        zes_power_properties_t* pProperties             ///< [in,out] Structure that will contain property data.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<zes_pwr_object_t*>( hPower )->dditable;
        auto pfnGetProperties = dditable->zes.Power.pfnGetProperties;
        if( nullptr == pfnGetProperties )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hPower = reinterpret_cast<zes_pwr_object_t*>( hPower )->handle;

        // forward to device-driver
        result = pfnGetProperties( hPower, pProperties );

        return result;
    }